

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parseDataListTest_Test::OpenDDLParserTest_parseDataListTest_Test
          (OpenDDLParserTest_parseDataListTest_Test *this)

{
  OpenDDLParserTest_parseDataListTest_Test *this_local;
  
  OpenDDLParserTest::OpenDDLParserTest(&this->super_OpenDDLParserTest);
  (this->super_OpenDDLParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLParserTest_parseDataListTest_Test_001e2bc0;
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseDataListTest) {
    Value *data(nullptr);
    size_t len(0);

    char *in(nullptr), *end(nullptr);
    char token1[] = "{1,2,3,4}";
    end = findEnd(token1, len);
    Reference *refs(nullptr);
    size_t numRefs(0), numValues(0);
    Value::ValueType type(Value::ValueType::ddl_none);
    in = OpenDDLParser::parseDataList(token1, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == in);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with integers
    std::list<int> expValues;
    expValues.push_back(1);
    expValues.push_back(2);
    expValues.push_back(3);
    expValues.push_back(4);
    EXPECT_EQ(4U, countItems(data));
    EXPECT_TRUE(testValues(Value::ValueType::ddl_int32, data, expValues));
    registerValueForDeletion(data);
    delete refs;

    char token2[] = "{ \"string1\",\"string2\"}";
    end = findEnd(token2, len);
    in = OpenDDLParser::parseDataList(token2, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with strings
    EXPECT_EQ(2U, countItems(data));
    std::string expStrings[2] = {
        "string1",
        "string2"
    };
    size_t i(0);
    while (nullptr != data) {
        const int res(strncmp(expStrings[i].c_str(), (char *)data->m_data, data->m_size));
        EXPECT_EQ(0, res);
        data = data->m_next;
        i++;
    }
    registerValueForDeletion(data);
    delete refs;
}